

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall
cppcms::widgets::select_multiple::add(select_multiple *this,string *opt,bool selected)

{
  byte in_DL;
  long in_RDI;
  element *this_00;
  string id;
  value_type *in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffeff;
  string *in_stack_ffffffffffffff00;
  string *in_stack_ffffffffffffff08;
  element *in_stack_ffffffffffffff10;
  unsigned_long in_stack_ffffffffffffff28;
  string local_38 [39];
  byte local_11;
  
  local_11 = in_DL & 1;
  this_00 = (element *)(in_RDI + 0x208);
  std::
  vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
  ::size((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
          *)this_00);
  impl::todec_string<unsigned_long>(in_stack_ffffffffffffff28);
  element::element(in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,
                   (bool)in_stack_fffffffffffffeff);
  std::
  vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
  ::push_back((vector<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
               *)this_00,in_stack_fffffffffffffed8);
  element::~element(this_00);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void select_multiple::add(std::string const &opt,bool selected)
{
	std::string id=impl::todec_string(elements_.size());
	elements_.push_back(element(id,opt,selected));
}